

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

logical pnga_create_irreg_config
                  (Integer type,Integer ndim,Integer *dims,char *array_name,Integer *map,
                  Integer *nblock,Integer p_handle,Integer *g_a)

{
  logical lVar1;
  Integer width [7];
  
  if (0 < ndim) {
    memset(width,0,ndim * 8);
  }
  lVar1 = pnga_create_ghosts_irreg_config(type,ndim,dims,width,array_name,map,nblock,p_handle,g_a);
  return lVar1;
}

Assistant:

logical pnga_create_irreg_config(
        Integer type,     /* MA type */ 
        Integer ndim,     /* number of dimensions */
        Integer dims[],   /* array of dimensions */
        char *array_name, /* array name */
        Integer map[],    /* decomposition map array */ 
        Integer nblock[], /* number of blocks for each dimension in map */
        Integer p_handle, /* processor list hande */
        Integer *g_a)     /* array handle (output) */
{
Integer  d,width[MAXDIM];
logical status;

      for (d=0; d<ndim; d++) width[d] = 0;
      status = pnga_create_ghosts_irreg_config(type, ndim, dims, width,
          array_name, map, nblock, p_handle, g_a);

      return status;
}